

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

Color __thiscall Color::subtract(Color *this,uint8_t value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined3 in_register_00000031;
  int iVar4;
  uint uVar5;
  
  iVar4 = CONCAT31(in_register_00000031,value);
  uVar1 = (uint)this->_r - iVar4;
  uVar2 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = uVar2;
  }
  uVar3 = (uint)this->_g - iVar4;
  if ((int)uVar3 < 1) {
    uVar3 = uVar2;
  }
  uVar5 = (uint)this->_b - iVar4;
  if ((int)uVar5 < 1) {
    uVar5 = uVar2;
  }
  return (Color)(uVar1 & 0xff | (uVar3 & 0xff) << 8 | (uVar5 & 0xff) << 0x10);
}

Assistant:

Color Color::subtract(uint8_t value) const
{
    int32_t r = _r - value;
    if(r < 0)
        r = 0;

    int32_t g = _g - value;
    if(g < 0)
        g = 0;

    int32_t b = _b - value;
    if(b < 0)
        b = 0;

    return { (uint8_t)r, (uint8_t)g, (uint8_t)b };
}